

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lut.c
# Opt level: O0

uint32_t chck_hash_table_collisions(chck_hash_table *table)

{
  size_t local_30;
  size_t _I;
  header *hdr;
  chck_hash_table *t;
  chck_hash_table *pcStack_10;
  uint32_t collisions;
  chck_hash_table *table_local;
  
  pcStack_10 = table;
  if (table == (chck_hash_table *)0x0) {
    __assert_fail("table",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/lut/lut.c",
                  0x157,"uint32_t chck_hash_table_collisions(struct chck_hash_table *)");
  }
  t._4_4_ = 0;
  for (hdr = (header *)table->next; hdr != (header *)0x0; hdr = *(header **)(hdr + 4)) {
    local_30 = 0;
    while (_I = (size_t)chck_lut_iter((chck_lut *)(hdr + 2),&local_30), (byte *)_I != (byte *)0x0) {
      if ((*(byte *)_I & 1) != 0) {
        t._4_4_ = t._4_4_ + 1;
      }
    }
  }
  return t._4_4_;
}

Assistant:

uint32_t
chck_hash_table_collisions(struct chck_hash_table *table)
{
   assert(table);

   uint32_t collisions = 0;
   for (struct chck_hash_table *t = table->next; t; t = t->next) {
      struct header *hdr;
      chck_lut_for_each(&t->meta, hdr) {
         if (hdr->placed)
            ++collisions;
      }
   }

   return collisions;
}